

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.cpp
# Opt level: O2

void __thiscall Perceptron::~Perceptron(Perceptron *this)

{
  std::__cxx11::string::~string((string *)&this->m_label);
  std::_Function_base::~_Function_base(&(this->m_activation).super__Function_base);
  return;
}

Assistant:

Perceptron::~Perceptron(){}